

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_unsigned_int>
* __thiscall
fmt::v7::make_args_checked<unsigned_int&,unsigned_int_const&,char_const*,char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_unsigned_int>
           *__return_storage_ptr__,v7 *this,char **format_str,
          remove_reference_t<unsigned_int_&> *args,remove_reference_t<const_unsigned_int_&> *args_1)

{
  remove_reference_t<const_unsigned_int_&> *args_local_1;
  remove_reference_t<unsigned_int_&> *args_local;
  char **format_str_local;
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_unsigned_int>
  ::format_arg_store(__return_storage_ptr__,(uint *)format_str,args);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}